

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXWebSocketHandshake.cpp
# Opt level: O1

string * __thiscall
ix::WebSocketHandshake::genRandomString_abi_cxx11_
          (string *__return_storage_ptr__,WebSocketHandshake *this,int len)

{
  uint uVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  ulong uVar4;
  uniform_int_distribution<int> dist;
  string alphanum;
  default_random_engine e1;
  random_device r;
  param_type local_13e8;
  long *local_13e0;
  int local_13d8;
  long local_13d0 [2];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13c0;
  random_device local_13b8;
  
  local_13e0 = local_13d0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_13e0,"0123456789ABCDEFGHabcdefgh","");
  ::std::random_device::random_device(&local_13b8);
  uVar1 = ::std::random_device::_M_getval();
  uVar3 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  local_13c0._M_x = (unsigned_long)(uVar3 + uVar1 + (uint)(uVar1 + uVar3 == 0));
  local_13e8._M_b = local_13d8 + -1;
  local_13e8._M_a = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)len);
  if (0 < len) {
    uVar4 = 0;
    do {
      rVar2 = ::std::uniform_int_distribution<int>::operator()(&local_13e8,&local_13c0,&local_13e8);
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar4] = *(char *)((long)local_13e0 + (long)rVar2);
      uVar4 = uVar4 + 1;
    } while ((uint)len != uVar4);
  }
  ::std::random_device::_M_fini();
  if (local_13e0 != local_13d0) {
    operator_delete(local_13e0,local_13d0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WebSocketHandshake::genRandomString(const int len)
    {
        std::string alphanum =
            "0123456789"
            "ABCDEFGH"
            "abcdefgh";

        std::random_device r;
        std::default_random_engine e1(r());
        std::uniform_int_distribution<int> dist(0, (int) alphanum.size() - 1);

        std::string s;
        s.resize(len);

        for (int i = 0; i < len; ++i)
        {
            int x = dist(e1);
            s[i] = alphanum[x];
        }

        return s;
    }